

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test4::generateUniformValues(GPUShaderFP64Test4 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint n_stage;
  long lVar32;
  uint n_double_ptr;
  long lVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  _stage_data *local_278 [6];
  _stage_data *local_248;
  double *local_240;
  long lStack_238;
  double *local_230;
  long lStack_228;
  double *local_220;
  long lStack_218;
  double *local_210;
  long lStack_208;
  double *local_200;
  long lStack_1f8;
  double *local_1f0;
  long lStack_1e8;
  double *local_1e0;
  long lStack_1d8;
  double *local_1d0;
  long lStack_1c8;
  double *local_1c0;
  long lStack_1b8;
  double *local_1b0;
  long lStack_1a8;
  _data *local_1a0;
  long lStack_198;
  double *local_190;
  long lStack_188;
  double *local_180;
  long lStack_178;
  double *local_170;
  long lStack_168;
  double *local_160;
  long lStack_158;
  double *local_150;
  long lStack_148;
  double *local_140;
  long lStack_138;
  double *local_130;
  long lStack_128;
  double *local_120;
  long lStack_118;
  double *local_110;
  long lStack_108;
  double *local_100;
  long lStack_f8;
  double *local_f0;
  long lStack_e8;
  double *local_e0;
  long lStack_d8;
  double *local_d0;
  long lStack_c8;
  double *local_c0;
  long lStack_b8;
  double *local_b0;
  long lStack_a8;
  double *local_a0;
  long lStack_98;
  double *local_90;
  long lStack_88;
  _stage_data *stages [6];
  
  local_278[0] = &this->m_data_cs;
  local_278[1] = &this->m_data_fs;
  local_278[2] = &this->m_data_gs;
  local_278[3] = &this->m_data_tc;
  local_278[4] = &this->m_data_te;
  local_278[5] = &this->m_data_vs;
  lVar32 = 0;
  do {
    local_248 = local_278[lVar32];
    uVar34 = SUB84(local_248,0);
    uVar35 = (undefined4)((ulong)local_248 >> 0x20);
    auVar1._8_4_ = uVar34;
    auVar1._0_8_ = local_248;
    auVar1._12_4_ = uVar35;
    local_230 = local_248->uniform_structure_arrays[0].uniform_dvec2;
    lStack_228 = auVar1._8_8_ + 0x20;
    auVar2._8_4_ = uVar34;
    auVar2._0_8_ = local_248;
    auVar2._12_4_ = uVar35;
    local_240 = local_248->uniform_structure_arrays[0].uniform_double_arr;
    lStack_238 = auVar2._8_8_ + 0x10;
    auVar3._8_4_ = uVar34;
    auVar3._0_8_ = local_248;
    auVar3._12_4_ = uVar35;
    local_210 = local_248->uniform_structure_arrays[0].uniform_dvec3;
    lStack_208 = auVar3._8_8_ + 0x50;
    auVar4._8_4_ = uVar34;
    auVar4._0_8_ = local_248;
    auVar4._12_4_ = uVar35;
    local_220 = local_248->uniform_structure_arrays[0].uniform_dvec2_arr;
    lStack_218 = auVar4._8_8_ + 0x30;
    auVar5._8_4_ = uVar34;
    auVar5._0_8_ = local_248;
    auVar5._12_4_ = uVar35;
    local_1f0 = local_248->uniform_structure_arrays[0].uniform_dvec3_arr + 1;
    lStack_1e8 = auVar5._8_8_ + 0x70;
    auVar6._8_4_ = uVar34;
    auVar6._0_8_ = local_248;
    auVar6._12_4_ = uVar35;
    local_200 = local_248->uniform_structure_arrays[0].uniform_dvec3 + 2;
    lStack_1f8 = auVar6._8_8_ + 0x60;
    auVar7._8_4_ = uVar34;
    auVar7._0_8_ = local_248;
    auVar7._12_4_ = uVar35;
    local_1d0 = local_248->uniform_structure_arrays[0].uniform_dvec4 + 2;
    lStack_1c8 = auVar7._8_8_ + 0xa8;
    auVar8._8_4_ = uVar34;
    auVar8._0_8_ = local_248;
    auVar8._12_4_ = uVar35;
    local_1e0 = local_248->uniform_structure_arrays[0].uniform_dvec4;
    lStack_1d8 = auVar8._8_8_ + 0x98;
    auVar9._8_4_ = uVar34;
    auVar9._0_8_ = local_248;
    auVar9._12_4_ = uVar35;
    local_1b0 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr + 2;
    lStack_1a8 = auVar9._8_8_ + 200;
    auVar10._8_4_ = uVar34;
    auVar10._0_8_ = local_248;
    auVar10._12_4_ = uVar35;
    local_1c0 = local_248->uniform_structure_arrays[0].uniform_dvec4_arr;
    lStack_1b8 = auVar10._8_8_ + 0xb8;
    auVar11._8_4_ = uVar34;
    auVar11._0_8_ = local_248;
    auVar11._12_4_ = uVar35;
    local_190 = local_248->uniform_structure_arrays[1].uniform_double_arr + 1;
    lStack_188 = auVar11._8_8_ + 0x138;
    auVar12._8_4_ = uVar34;
    auVar12._0_8_ = local_248;
    auVar12._12_4_ = uVar35;
    local_1a0 = local_248->uniform_structure_arrays + 1;
    lStack_198 = auVar12._8_8_ + 0x128;
    auVar13._8_4_ = uVar34;
    auVar13._0_8_ = local_248;
    auVar13._12_4_ = uVar35;
    local_170 = local_248->uniform_structure_arrays[1].uniform_dvec2_arr + 1;
    lStack_168 = auVar13._8_8_ + 0x168;
    auVar14._8_4_ = uVar34;
    auVar14._0_8_ = local_248;
    auVar14._12_4_ = uVar35;
    local_180 = local_248->uniform_structure_arrays[1].uniform_dvec2 + 1;
    lStack_178 = auVar14._8_8_ + 0x148;
    auVar15._8_4_ = uVar34;
    auVar15._0_8_ = local_248;
    auVar15._12_4_ = uVar35;
    local_150 = local_248->uniform_structure_arrays[1].uniform_dvec3_arr;
    lStack_148 = auVar15._8_8_ + 0x188;
    auVar16._8_4_ = uVar34;
    auVar16._0_8_ = local_248;
    auVar16._12_4_ = uVar35;
    local_160 = local_248->uniform_structure_arrays[1].uniform_dvec3 + 1;
    lStack_158 = auVar16._8_8_ + 0x178;
    auVar17._8_4_ = uVar34;
    auVar17._0_8_ = local_248;
    auVar17._12_4_ = uVar35;
    local_130 = local_248->uniform_structure_arrays[1].uniform_dvec4 + 1;
    lStack_128 = auVar17._8_8_ + 0x1c0;
    auVar18._8_4_ = uVar34;
    auVar18._0_8_ = local_248;
    auVar18._12_4_ = uVar35;
    local_140 = local_248->uniform_structure_arrays[1].uniform_dvec3_arr + 2;
    lStack_138 = auVar18._8_8_ + 0x1b0;
    auVar19._8_4_ = uVar34;
    auVar19._0_8_ = local_248;
    auVar19._12_4_ = uVar35;
    local_110 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr + 1;
    lStack_108 = auVar19._8_8_ + 0x1e0;
    auVar20._8_4_ = uVar34;
    auVar20._0_8_ = local_248;
    auVar20._12_4_ = uVar35;
    local_120 = local_248->uniform_structure_arrays[1].uniform_dvec4 + 3;
    lStack_118 = auVar20._8_8_ + 0x1d0;
    auVar21._8_4_ = uVar34;
    auVar21._0_8_ = local_248;
    auVar21._12_4_ = uVar35;
    local_f0 = (local_248->uniforms).uniform_double_arr;
    lStack_e8 = auVar21._8_8_ + 0x250;
    auVar22._8_4_ = uVar34;
    auVar22._0_8_ = local_248;
    auVar22._12_4_ = uVar35;
    local_100 = local_248->uniform_structure_arrays[1].uniform_dvec4_arr + 3;
    lStack_f8 = auVar22._8_8_ + 0x240;
    auVar23._8_4_ = uVar34;
    auVar23._0_8_ = local_248;
    auVar23._12_4_ = uVar35;
    local_d0 = (local_248->uniforms).uniform_dvec2_arr;
    lStack_c8 = auVar23._8_8_ + 0x270;
    auVar24._8_4_ = uVar34;
    auVar24._0_8_ = local_248;
    auVar24._12_4_ = uVar35;
    local_e0 = (local_248->uniforms).uniform_dvec2;
    lStack_d8 = auVar24._8_8_ + 0x260;
    auVar25._8_4_ = uVar34;
    auVar25._0_8_ = local_248;
    auVar25._12_4_ = uVar35;
    local_b0 = (local_248->uniforms).uniform_dvec3;
    lStack_a8 = auVar25._8_8_ + 0x290;
    auVar26._8_4_ = uVar34;
    auVar26._0_8_ = local_248;
    auVar26._12_4_ = uVar35;
    local_c0 = (local_248->uniforms).uniform_dvec2_arr + 2;
    lStack_b8 = auVar26._8_8_ + 0x280;
    auVar27._8_4_ = uVar34;
    auVar27._0_8_ = local_248;
    auVar27._12_4_ = uVar35;
    local_90 = (local_248->uniforms).uniform_dvec3_arr + 1;
    lStack_88 = auVar27._8_8_ + 0x2b0;
    auVar28._8_4_ = uVar34;
    auVar28._0_8_ = local_248;
    auVar28._12_4_ = uVar35;
    local_a0 = (local_248->uniforms).uniform_dvec3 + 2;
    lStack_98 = auVar28._8_8_ + 0x2a0;
    auVar29._8_4_ = uVar34;
    auVar29._0_8_ = local_248;
    auVar29._12_4_ = uVar35;
    stages[2] = (_stage_data *)((local_248->uniforms).uniform_dvec3_arr + 5);
    stages[3] = (_stage_data *)(auVar29._8_8_ + 0x2d0);
    auVar30._8_4_ = uVar34;
    auVar30._0_8_ = local_248;
    auVar30._12_4_ = uVar35;
    stages[0] = (_stage_data *)((local_248->uniforms).uniform_dvec3_arr + 3);
    stages[1] = (_stage_data *)(auVar30._8_8_ + 0x2c0);
    auVar31._8_4_ = uVar34;
    auVar31._0_8_ = local_248;
    auVar31._12_4_ = uVar35;
    stages[4] = (_stage_data *)((local_248->uniforms).uniform_dvec4 + 1);
    stages[5] = (_stage_data *)(auVar31._8_8_ + 0x2e0);
    lVar33 = 0;
    do {
      (&local_248)[lVar33]->uniform_structure_arrays[0].uniform_double =
           (double)(int)(-(generateUniformValues::seed & 1U) | 1) *
           ((double)(generateUniformValues::seed % 0x6c4) / 125.7);
      generateUniformValues::seed = generateUniformValues::seed + 0x2ef;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 0x48);
    lVar32 = lVar32 + 1;
  } while (lVar32 != 6);
  return;
}

Assistant:

void GPUShaderFP64Test4::generateUniformValues()
{
	_stage_data*	   stages[] = { &m_data_cs, &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		_stage_data* stage_ptr = stages[n_stage];

		/* Iterate through all uniform components and assign them double values */
		double* double_ptrs[] = {
			&stage_ptr->uniform_structure_arrays[0].uniform_double,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[0].uniform_dvec4 + 7,
			&stage_ptr->uniform_structure_arrays[1].uniform_double,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_double_arr + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec2 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec3 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 0,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 1,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 2,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 3,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 4,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 5,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 6,
			stage_ptr->uniform_structure_arrays[1].uniform_dvec4 + 7,
			&stage_ptr->uniforms.uniform_double,
			stage_ptr->uniforms.uniform_double_arr + 0,
			stage_ptr->uniforms.uniform_double_arr + 1,
			stage_ptr->uniforms.uniform_dvec2 + 0,
			stage_ptr->uniforms.uniform_dvec2 + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 0,
			stage_ptr->uniforms.uniform_dvec2_arr + 1,
			stage_ptr->uniforms.uniform_dvec2_arr + 2,
			stage_ptr->uniforms.uniform_dvec2_arr + 3,
			stage_ptr->uniforms.uniform_dvec3 + 0,
			stage_ptr->uniforms.uniform_dvec3 + 1,
			stage_ptr->uniforms.uniform_dvec3 + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 0,
			stage_ptr->uniforms.uniform_dvec3_arr + 1,
			stage_ptr->uniforms.uniform_dvec3_arr + 2,
			stage_ptr->uniforms.uniform_dvec3_arr + 3,
			stage_ptr->uniforms.uniform_dvec3_arr + 4,
			stage_ptr->uniforms.uniform_dvec3_arr + 5,
			stage_ptr->uniforms.uniform_dvec4 + 0,
			stage_ptr->uniforms.uniform_dvec4 + 1,
			stage_ptr->uniforms.uniform_dvec4 + 2,
			stage_ptr->uniforms.uniform_dvec4 + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 0,
			stage_ptr->uniforms.uniform_dvec4_arr + 1,
			stage_ptr->uniforms.uniform_dvec4_arr + 2,
			stage_ptr->uniforms.uniform_dvec4_arr + 3,
			stage_ptr->uniforms.uniform_dvec4_arr + 4,
			stage_ptr->uniforms.uniform_dvec4_arr + 5,
			stage_ptr->uniforms.uniform_dvec4_arr + 6,
			stage_ptr->uniforms.uniform_dvec4_arr + 7,
		};
		const unsigned int n_double_ptrs = sizeof(double_ptrs) / sizeof(double_ptrs[0]);

		for (unsigned int n_double_ptr = 0; n_double_ptr < n_double_ptrs; ++n_double_ptr)
		{
			double* double_ptr = double_ptrs[n_double_ptr];

			/* Generate the value. Use magic numbers to generate a set of double-precision
			 * floating-point numbers.
			 */
			static int seed = 16762362;

			*double_ptr = ((double)(seed % 1732)) / 125.7 * (((seed % 2) == 0) ? 1 : -1);

			seed += 751;
		} /* for (all pointers to double variables) */
	}	 /* for (all stages) */
}